

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O3

void __thiscall
QtPromisePrivate::PromiseDataBase<bool,_void_(const_bool_&)>::addHandler
          (PromiseDataBase<bool,_void_(const_bool_&)> *this,function<void_(const_bool_&)> *handler)

{
  _Manager_type p_Var1;
  Data *pDVar2;
  pair<QPointer<QThread>,_std::function<void_(const_bool_&)>_> local_50;
  
  QReadWriteLock::lockForWrite();
  local_50.first.wp.value = (QObject *)QThread::currentThread();
  if (local_50.first.wp.value == (QObject *)0x0) {
    local_50.first.wp.d = (Data *)0x0;
  }
  else {
    local_50.first.wp.d =
         (Data *)QtSharedPointer::ExternalRefCountData::getAndRef(local_50.first.wp.value);
  }
  local_50.second.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_50.second.super__Function_base._M_functor._8_8_ = 0;
  local_50.second.super__Function_base._M_manager = (_Manager_type)0x0;
  local_50.second._M_invoker = handler->_M_invoker;
  p_Var1 = (handler->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    local_50.second.super__Function_base._M_functor._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(handler->super__Function_base)._M_functor;
    local_50.second.super__Function_base._M_functor._8_8_ =
         *(undefined8 *)((long)&(handler->super__Function_base)._M_functor + 8);
    (handler->super__Function_base)._M_manager = (_Manager_type)0x0;
    handler->_M_invoker = (_Invoker_type)0x0;
    local_50.second.super__Function_base._M_manager = p_Var1;
  }
  QtPrivate::QGenericArrayOps<std::pair<QPointer<QThread>,std::function<void(bool_const&)>>>::
  emplace<std::pair<QPointer<QThread>,std::function<void(bool_const&)>>>
            ((QGenericArrayOps<std::pair<QPointer<QThread>,std::function<void(bool_const&)>>> *)
             &this->m_handlers,(this->m_handlers).d.size,&local_50);
  if (local_50.second.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_50.second.super__Function_base._M_manager)
              ((_Any_data *)&local_50.second,(_Any_data *)&local_50.second,__destroy_functor);
  }
  if (local_50.first.wp.d != (Data *)0x0) {
    LOCK();
    ((local_50.first.wp.d)->weakref)._q_value.super___atomic_base<int>._M_i =
         ((local_50.first.wp.d)->weakref)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.first.wp.d)->weakref)._q_value.super___atomic_base<int>._M_i == 0) {
      pDVar2 = local_50.first.wp.d;
      if (local_50.first.wp.d == (Data *)0x0) {
        pDVar2 = (Data *)0x0;
      }
      operator_delete(pDVar2);
    }
  }
  if (((ulong)&this->field_0x11 & 1) != 0) {
    QReadWriteLock::unlock();
  }
  return;
}

Assistant:

void addHandler(std::function<F> handler)
    {
        QWriteLocker lock{&m_lock};
        m_handlers.append({QThread::currentThread(), std::move(handler)});
    }